

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O0

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::Resize
          (WeakReferenceHashTable<PrimePolicy> *this,int newSize)

{
  HeapAllocator *this_00;
  Type pRVar1;
  code *pcVar2;
  bool bVar3;
  hash_t hVar4;
  Memory *this_01;
  undefined4 *puVar5;
  RecyclerWeakReferenceBase *next;
  RecyclerWeakReferenceBase *pRStack_68;
  int targetBucket;
  RecyclerWeakReferenceBase *current;
  uint i;
  TrackAllocData local_48;
  RecyclerWeakReferenceBase **local_20;
  RecyclerWeakReferenceBase **newBuckets;
  uint copiedEntries;
  int newSize_local;
  WeakReferenceHashTable<PrimePolicy> *this_local;
  
  newBuckets._0_4_ = 0;
  this_00 = this->allocator;
  newBuckets._4_4_ = newSize;
  _copiedEntries = this;
  TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&RecyclerWeakReferenceBase*::typeinfo,0,(long)newSize,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
             ,0x137);
  this_01 = (Memory *)HeapAllocator::TrackAllocInfo(this_00,&local_48);
  local_20 = AllocateArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*,false>
                       (this_01,(HeapAllocator *)HeapAllocator::AllocZero,0,
                        (long)(int)newBuckets._4_4_);
  for (current._4_4_ = 0; current._4_4_ < this->size; current._4_4_ = current._4_4_ + 1) {
    pRStack_68 = this->buckets[current._4_4_];
    while (pRStack_68 != (RecyclerWeakReferenceBase *)0x0) {
      hVar4 = HashKeyToBucket(this,pRStack_68->strongRef,newBuckets._4_4_);
      pRVar1 = pRStack_68->next;
      AddEntry(this,pRStack_68,local_20 + (int)hVar4);
      newBuckets._0_4_ = (uint)newBuckets + 1;
      pRStack_68 = pRVar1;
    }
  }
  DeleteArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*>
            (this->allocator,(ulong)this->size,this->buckets);
  this->size = newBuckets._4_4_;
  this->buckets = local_20;
  if (this->count != (uint)newBuckets) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x14d,"(this->count == copiedEntries)","this->count == copiedEntries");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void Resize(int newSize)
    {
#if DEBUG
        uint copiedEntries = 0;
#endif
        RecyclerWeakReferenceBase** newBuckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, newSize);

        for (uint i=0; i < size; i++)
        {
            RecyclerWeakReferenceBase* current = buckets[i];
            while (current != nullptr)
            {
                int targetBucket = HashKeyToBucket(current->strongRef, newSize);
                RecyclerWeakReferenceBase* next = current->next; // Cache the next pointer

                AddEntry(current, &newBuckets[targetBucket]);
#if DEBUG
                copiedEntries++;
#endif
                current = next;
            }
        }

        AllocatorDeleteArray(HeapAllocator, allocator, size, buckets);
        size = newSize;
        buckets = newBuckets;
#if DEBUG
        Assert(this->count == copiedEntries);
#endif
    }